

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O0

void __thiscall MeCab::Viterbi::~Viterbi(Viterbi *this)

{
  whatlog *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__Viterbi_00248640;
  whatlog::~whatlog(in_RDI);
  scoped_ptr<MeCab::Connector>::~scoped_ptr((scoped_ptr<MeCab::Connector> *)in_RDI);
  scoped_ptr<MeCab::Tokenizer<mecab_node_t,_mecab_path_t>_>::~scoped_ptr
            ((scoped_ptr<MeCab::Tokenizer<mecab_node_t,_mecab_path_t>_> *)in_RDI);
  return;
}

Assistant:

Viterbi::~Viterbi() {}